

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O0

void vkt::tessellation::anon_unknown_0::InvariantOuterEdge::logOuterTessellationLevel
               (TestLog *log,float tessLevel,OuterEdgeDescription *edgeDesc)

{
  MessageBuilder *pMVar1;
  string local_1d0;
  MessageBuilder local_1a0;
  OuterEdgeDescription *local_20;
  OuterEdgeDescription *edgeDesc_local;
  TestLog *pTStack_10;
  float tessLevel_local;
  TestLog *log_local;
  
  local_20 = edgeDesc;
  edgeDesc_local._4_4_ = tessLevel;
  pTStack_10 = log;
  tcu::TestLog::operator<<(&local_1a0,log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<
                     (&local_1a0,(char (*) [39])"Testing with outer tessellation level ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(float *)((long)&edgeDesc_local + 4));
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [10])" for the ");
  tessellation::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
            (&local_1d0,local_20);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_1d0);
  pMVar1 = tcu::MessageBuilder::operator<<
                     (pMVar1,(char (*) [70])
                             " edge, and with various levels for other edges, and with all programs"
                     );
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_1d0);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  return;
}

Assistant:

void logOuterTessellationLevel (tcu::TestLog& log, const float tessLevel, const OuterEdgeDescription& edgeDesc)
{
	log << tcu::TestLog::Message
		<< "Testing with outer tessellation level " << tessLevel << " for the " << edgeDesc.description() << " edge, and with various levels for other edges, and with all programs"
		<< tcu::TestLog::EndMessage;
}